

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_rldcr1(DisasContext_conflict10 *ctx)

{
  gen_rldcr(ctx,1);
  return;
}

Assistant:

static void gen_rldimi(DisasContext *ctx, int mbn, int shn)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t_ra = cpu_gpr[rA(ctx->opcode)];
    TCGv t_rs = cpu_gpr[rS(ctx->opcode)];
    uint32_t sh = SH(ctx->opcode) | (shn << 5);
    uint32_t mb = MB(ctx->opcode) | (mbn << 5);
    uint32_t me = 63 - sh;

    if (mb <= me) {
        tcg_gen_deposit_tl(tcg_ctx, t_ra, t_ra, t_rs, sh, me - mb + 1);
    } else {
        target_ulong mask = MASK(mb, me);
        TCGv t1 = tcg_temp_new(tcg_ctx);

        tcg_gen_rotli_tl(tcg_ctx, t1, t_rs, sh);
        tcg_gen_andi_tl(tcg_ctx, t1, t1, mask);
        tcg_gen_andi_tl(tcg_ctx, t_ra, t_ra, ~mask);
        tcg_gen_or_tl(tcg_ctx, t_ra, t_ra, t1);
        tcg_temp_free(tcg_ctx, t1);
    }
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, t_ra);
    }
}